

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

void world_act_npcs(void *world_void)

{
  long *plVar1;
  undefined8 *puVar2;
  NPC *this;
  long *plVar3;
  undefined8 *puVar4;
  double dVar5;
  
  dVar5 = Timer::GetTime();
  plVar1 = *(long **)((long)world_void + 0x4d0);
  for (plVar3 = *(long **)((long)world_void + 0x4c8); plVar3 != plVar1; plVar3 = plVar3 + 1) {
    puVar2 = *(undefined8 **)(*plVar3 + 0x40);
    for (puVar4 = *(undefined8 **)(*plVar3 + 0x38); puVar4 != puVar2; puVar4 = puVar4 + 1) {
      this = (NPC *)*puVar4;
      if ((this->alive == true) && (this->last_act + this->act_speed < dVar5)) {
        NPC::Act(this);
      }
    }
  }
  return;
}

Assistant:

void world_act_npcs(void *world_void)
{
	World *world(static_cast<World *>(world_void));

	double current_time = Timer::GetTime();
	UTIL_FOREACH(world->maps, map)
	{
		UTIL_FOREACH(map->npcs, npc)
		{
			if (npc->alive && npc->last_act + npc->act_speed < current_time)
			{
				npc->Act();
			}
		}
	}
}